

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::class_<OmegaOP>::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  instance *piVar2;
  byte bVar3;
  
  bVar3 = v_h->inst->field_0x30;
  if ((bVar3 & 2) == 0) {
    bVar3 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar3 = bVar3 >> 2;
  }
  if ((bVar3 & 1) == 0) {
    operator_delete(*v_h->vh);
  }
  else {
    std::unique_ptr<OmegaOP,_std::default_delete<OmegaOP>_>::~unique_ptr
              ((unique_ptr<OmegaOP,_std::default_delete<OmegaOP>_> *)(v_h->vh + 1));
    piVar2 = v_h->inst;
    if ((piVar2->field_0x30 & 2) == 0) {
      pbVar1 = (piVar2->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar2->field_0x30 = piVar2->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }